

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_type_info.hpp
# Opt level: O3

void __thiscall
duckdb::EnumTypeInfoTemplated<unsigned_short>::EnumTypeInfoTemplated
          (EnumTypeInfoTemplated<unsigned_short> *this,Vector *values_insert_order_p,idx_t size_p)

{
  const_iterator cVar1;
  mapped_type *pmVar2;
  InvalidInputException *this_00;
  InternalException *this_01;
  ulong uVar3;
  idx_t iVar4;
  idx_t iVar5;
  key_type *__k;
  char *pcVar6;
  UnifiedVectorFormat vdata;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  UnifiedVectorFormat local_78;
  
  EnumTypeInfo::EnumTypeInfo(&this->super_EnumTypeInfo,values_insert_order_p,size_p);
  (this->super_EnumTypeInfo).super_ExtraTypeInfo._vptr_ExtraTypeInfo =
       (_func_int **)&PTR__EnumTypeInfoTemplated_0243e4f8;
  (this->values)._M_h._M_buckets = &(this->values)._M_h._M_single_bucket;
  (this->values)._M_h._M_bucket_count = 1;
  (this->values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->values)._M_h._M_element_count = 0;
  (this->values)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->values)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->values)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(&(this->super_EnumTypeInfo).values_insert_order,size_p,&local_78);
  if (size_p != 0) {
    iVar4 = 0;
    do {
      iVar5 = iVar4;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar5 = (idx_t)(local_78.sel)->sel_vector[iVar4];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0) &&
         ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar5 >> 6] >>
           (iVar5 & 0x3f) & 1) == 0)) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Attempted to create ENUM type with NULL value","");
        InternalException::InternalException(this_01,&local_b8);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      __k = (key_type *)(local_78.data + iVar5 * 0x10);
      cVar1 = std::
              _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_short>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_short>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->values)._M_h,__k);
      if (cVar1.super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_short>,_true>.
          _M_cur != (__node_type *)0x0) {
        this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b8,"Attempted to create ENUM type with duplicate value %s","");
        uVar3 = (ulong)(__k->value).pointer.length;
        if (uVar3 < 0xd) {
          pcVar6 = (__k->value).pointer.prefix;
        }
        else {
          pcVar6 = (__k->value).pointer.ptr;
        }
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,pcVar6,pcVar6 + uVar3)
        ;
        InvalidInputException::InvalidInputException<std::__cxx11::string>
                  (this_00,&local_b8,&local_98);
        __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pmVar2 = std::__detail::
               _Map_base<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_short>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_short>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_short>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_short>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->values,__k);
      *pmVar2 = (mapped_type)iVar4;
      iVar4 = iVar4 + 1;
    } while (size_p != iVar4);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

explicit EnumTypeInfoTemplated(Vector &values_insert_order_p, idx_t size_p)
	    : EnumTypeInfo(values_insert_order_p, size_p) {
		D_ASSERT(values_insert_order_p.GetType().InternalType() == PhysicalType::VARCHAR);

		UnifiedVectorFormat vdata;
		values_insert_order.ToUnifiedFormat(size_p, vdata);

		auto data = UnifiedVectorFormat::GetData<string_t>(vdata);
		for (idx_t i = 0; i < size_p; i++) {
			auto idx = vdata.sel->get_index(i);
			if (!vdata.validity.RowIsValid(idx)) {
				throw InternalException("Attempted to create ENUM type with NULL value");
			}
			if (values.count(data[idx]) > 0) {
				throw InvalidInputException("Attempted to create ENUM type with duplicate value %s",
				                            data[idx].GetString());
			}
			values[data[idx]] = UnsafeNumericCast<T>(i);
		}
	}